

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

CBString * itemSubtypeToUString(CBString *__return_storage_ptr__,UINT8 type,UINT8 subtype)

{
  UINT8 subtype_local;
  UINT8 type_local;
  
  switch(type) {
  case '=':
    if (subtype == 'd') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Aptio signed");
      return __return_storage_ptr__;
    }
    if (subtype == 'e') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Aptio unsigned");
      return __return_storage_ptr__;
    }
    if (subtype == 'f') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"UEFI 2.0");
      return __return_storage_ptr__;
    }
    if (subtype == 'g') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Toshiba");
      return __return_storage_ptr__;
    }
    break;
  case '>':
    if (subtype == 'Z') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Intel");
      return __return_storage_ptr__;
    }
    if (subtype == '[') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"UEFI");
      return __return_storage_ptr__;
    }
    break;
  case '?':
    regionTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  case '@':
    if (subtype == 'x') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Empty (0x00)");
      return __return_storage_ptr__;
    }
    if (subtype == 'y') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Empty (0xFF)");
      return __return_storage_ptr__;
    }
    if (subtype == 'z') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Non-empty");
      return __return_storage_ptr__;
    }
    break;
  case 'A':
    if (subtype == 'n') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Unknown");
      return __return_storage_ptr__;
    }
    if (subtype == 'o') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"FFSv2");
      return __return_storage_ptr__;
    }
    if (subtype == 'p') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"FFSv3");
      return __return_storage_ptr__;
    }
    if (subtype == 'q') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"NVRAM");
      return __return_storage_ptr__;
    }
    if (subtype == 'r') {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Microcode");
      return __return_storage_ptr__;
    }
    break;
  case 'B':
    fileTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  case 'C':
    sectionTypeToUString(__return_storage_ptr__,subtype);
    return __return_storage_ptr__;
  case 'O':
    if (subtype == 0x82) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Invalid");
      return __return_storage_ptr__;
    }
    if (subtype == 0x83) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Invalid link");
      return __return_storage_ptr__;
    }
    if (subtype == 0x84) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Link");
      return __return_storage_ptr__;
    }
    if (subtype == 0x85) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Data");
      return __return_storage_ptr__;
    }
    if (subtype == 0x86) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Full");
      return __return_storage_ptr__;
    }
    break;
  case 'P':
    if (subtype == 0x8c) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Invalid");
      return __return_storage_ptr__;
    }
    if (subtype == 0x8d) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Standard");
      return __return_storage_ptr__;
    }
    if (subtype == 0x8e) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Apple");
      return __return_storage_ptr__;
    }
    if (subtype == 0x8f) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Auth");
      return __return_storage_ptr__;
    }
    if (subtype == 0x90) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Intel");
      return __return_storage_ptr__;
    }
    break;
  case 'Q':
    if (subtype == 0x96) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Invalid");
      return __return_storage_ptr__;
    }
    if (subtype == 0x97) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Normal");
      return __return_storage_ptr__;
    }
    break;
  case 'R':
    if (subtype == 0xa0) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Invalid");
      return __return_storage_ptr__;
    }
    if (subtype == 0xa1) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Unknown");
      return __return_storage_ptr__;
    }
    if (subtype == 0xa2) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"GUID");
      return __return_storage_ptr__;
    }
    if (subtype == 0xa3) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Name");
      return __return_storage_ptr__;
    }
    if (subtype == 0xa4) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Data");
      return __return_storage_ptr__;
    }
    break;
  case 'S':
    if (subtype == 0xaa) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Volume");
      return __return_storage_ptr__;
    }
    if (subtype == 0xab) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Data");
      return __return_storage_ptr__;
    }
    if (subtype == 0xac) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Unknown");
      return __return_storage_ptr__;
    }
    break;
  case 'U':
    if (subtype == 0xb4) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Intel");
      return __return_storage_ptr__;
    }
    if (subtype == 0xb5) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"AMD");
      return __return_storage_ptr__;
    }
    break;
  case 'X':
    if (subtype == 0xc9) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Boot");
      return __return_storage_ptr__;
    }
    if (subtype == 200) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Data");
      return __return_storage_ptr__;
    }
    break;
  case 'Z':
    if (subtype == 0xd2) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Valid");
      return __return_storage_ptr__;
    }
    if (subtype == 0xd3) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Invalid");
      return __return_storage_ptr__;
    }
    break;
  case '[':
    if (subtype == 0xdc) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Code");
      return __return_storage_ptr__;
    }
    if (subtype == 0xdd) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Data");
      return __return_storage_ptr__;
    }
    if (subtype == 0xde) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"GLUT");
      return __return_storage_ptr__;
    }
    break;
  case 'a':
    if (subtype == 0xe6) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Manifest");
      return __return_storage_ptr__;
    }
    if (subtype == 0xe7) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Metadata");
      return __return_storage_ptr__;
    }
    if (subtype == 0xe8) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Key");
      return __return_storage_ptr__;
    }
    if (subtype == 0xe9) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Code");
      return __return_storage_ptr__;
    }
    break;
  case 'd':
    if (subtype == 0xf0) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"X86 128K");
      return __return_storage_ptr__;
    }
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UString itemSubtypeToUString(const UINT8 type, const UINT8 subtype)
{
    switch (type) {
        case Types::Image:
            if      (subtype == Subtypes::IntelImage)                   return UString("Intel");
            else if (subtype == Subtypes::UefiImage)                    return UString("UEFI");
            break;
        case Types::Padding:
            if      (subtype == Subtypes::ZeroPadding)                  return UString("Empty (0x00)");
            else if (subtype == Subtypes::OnePadding)                   return UString("Empty (0xFF)");
            else if (subtype == Subtypes::DataPadding)                  return UString("Non-empty");
            break;
        case Types::Volume:
            if      (subtype == Subtypes::UnknownVolume)                return UString("Unknown");
            else if (subtype == Subtypes::Ffs2Volume)                   return UString("FFSv2");
            else if (subtype == Subtypes::Ffs3Volume)                   return UString("FFSv3");
            else if (subtype == Subtypes::NvramVolume)                  return UString("NVRAM");
            else if (subtype == Subtypes::MicrocodeVolume)              return UString("Microcode");
            break;
        case Types::Capsule:
            if      (subtype == Subtypes::AptioSignedCapsule)           return UString("Aptio signed");
            else if (subtype == Subtypes::AptioUnsignedCapsule)         return UString("Aptio unsigned");
            else if (subtype == Subtypes::UefiCapsule)                  return UString("UEFI 2.0");
            else if (subtype == Subtypes::ToshibaCapsule)               return UString("Toshiba");
            break;
        case Types::Region:                                             return regionTypeToUString(subtype);
        case Types::File:                                               return fileTypeToUString(subtype);
        case Types::Section:                                            return sectionTypeToUString(subtype);
        case Types::NvarEntry:
            if      (subtype == Subtypes::InvalidNvarEntry)             return UString("Invalid");
            else if (subtype == Subtypes::InvalidLinkNvarEntry)         return UString("Invalid link");
            else if (subtype == Subtypes::LinkNvarEntry)                return UString("Link");
            else if (subtype == Subtypes::DataNvarEntry)                return UString("Data");
            else if (subtype == Subtypes::FullNvarEntry)                return UString("Full");
            break;
        case Types::VssEntry:
            if      (subtype == Subtypes::InvalidVssEntry)              return UString("Invalid");
            else if (subtype == Subtypes::StandardVssEntry)             return UString("Standard");
            else if (subtype == Subtypes::AppleVssEntry)                return UString("Apple");
            else if (subtype == Subtypes::AuthVssEntry)                 return UString("Auth");
            else if (subtype == Subtypes::IntelVssEntry)                return UString("Intel");
            break;
        case Types::SysFEntry:
            if      (subtype == Subtypes::InvalidSysFEntry)             return UString("Invalid");
            else if (subtype == Subtypes::NormalSysFEntry)              return UString("Normal");
            break;
        case Types::EvsaEntry:
            if      (subtype == Subtypes::InvalidEvsaEntry)             return UString("Invalid");
            else if (subtype == Subtypes::UnknownEvsaEntry)             return UString("Unknown");
            else if (subtype == Subtypes::GuidEvsaEntry)                return UString("GUID");
            else if (subtype == Subtypes::NameEvsaEntry)                return UString("Name");
            else if (subtype == Subtypes::DataEvsaEntry)                return UString("Data");
            break;
        case Types::PhoenixFlashMapEntry:
            if      (subtype == Subtypes::VolumeFlashMapEntry)          return UString("Volume");
            else if (subtype == Subtypes::DataFlashMapEntry)            return UString("Data");
            else if (subtype == Subtypes::UnknownFlashMapEntry)         return UString("Unknown");
            break;
        case Types::Microcode:
            if      (subtype == Subtypes::IntelMicrocode)               return UString("Intel");
            else if (subtype == Subtypes::AmdMicrocode)                 return UString("AMD");
            break;
        case Types::FptEntry:
            if      (subtype == Subtypes::ValidFptEntry)                return UString("Valid");
            else if (subtype == Subtypes::InvalidFptEntry)              return UString("Invalid");
            break;
        case Types::FptPartition:
            if      (subtype == Subtypes::CodeFptPartition)             return UString("Code");
            else if (subtype == Subtypes::DataFptPartition)             return UString("Data");
            else if (subtype == Subtypes::GlutFptPartition)             return UString("GLUT");
            break;
        case Types::IfwiPartition:
            if      (subtype == Subtypes::BootIfwiPartition)            return UString("Boot");
            else if (subtype == Subtypes::DataIfwiPartition)            return UString("Data");
            break;
        case Types::CpdPartition:
            if      (subtype == Subtypes::ManifestCpdPartition)         return UString("Manifest");
            else if (subtype == Subtypes::MetadataCpdPartition)         return UString("Metadata");
            else if (subtype == Subtypes::KeyCpdPartition)              return UString("Key");
            else if (subtype == Subtypes::CodeCpdPartition)             return UString("Code");
            break;
        case Types::StartupApDataEntry:
            if      (subtype == Subtypes::x86128kStartupApDataEntry)    return UString("X86 128K");
            break;
    }
    
    return UString();
}